

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

NodeAndBucket __thiscall
google::protobuf::internal::KeyMapBase<unsigned_int>::FindHelper
          (KeyMapBase<unsigned_int> *this,ViewType k,TreeIterator *it)

{
  TableEntryPtr entry;
  map_index_t b;
  NodeBase *pNVar1;
  NodeAndBucket NVar2;
  
  b = BucketNumber(this,k);
  entry = (this->super_UntypedMapBase).table_[b];
  if ((entry & 1) == 0 && entry != 0) {
    pNVar1 = TableEntryToNode(entry);
    do {
      if (*(ViewType *)&pNVar1[1].next == k) goto LAB_001554dc;
      pNVar1 = pNVar1->next;
    } while (pNVar1 != (NodeBase *)0x0);
  }
  else if ((entry & 1) != 0) {
    NVar2 = UntypedMapBase::FindFromTree
                      (&this->super_UntypedMapBase,b,(VariantKey)(ZEXT416(k) << 0x40),it);
    pNVar1 = NVar2.node;
    b = NVar2.bucket;
    goto LAB_001554dc;
  }
  pNVar1 = (NodeBase *)0x0;
LAB_001554dc:
  NVar2.bucket = b;
  NVar2.node = pNVar1;
  NVar2._12_4_ = 0;
  return NVar2;
}

Assistant:

NodeAndBucket FindHelper(typename TS::ViewType k,
                           TreeIterator* it = nullptr) const {
    map_index_t b = BucketNumber(k);
    if (TableEntryIsNonEmptyList(b)) {
      auto* node = internal::TableEntryToNode(table_[b]);
      do {
        if (TS::Equals(static_cast<KeyNode*>(node)->key(), k)) {
          return {node, b};
        } else {
          node = node->next;
        }
      } while (node != nullptr);
    } else if (TableEntryIsTree(b)) {
      return FindFromTree(b, internal::RealKeyToVariantKey<Key>{}(k), it);
    }
    return {nullptr, b};
  }